

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<bool>::~RepeatedField(RepeatedField<bool> *this)

{
  bool *pbVar1;
  
  if (0 < this->total_size_) {
    pbVar1 = elements(this);
    if (*(long *)(pbVar1 + -8) == 0) {
      operator_delete(pbVar1 + -8);
      return;
    }
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}